

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined8 uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  int iVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  long lVar33;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar34;
  RTCRayN *pRVar35;
  undefined4 uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar48;
  ulong uVar49;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar50;
  long lVar51;
  long lVar52;
  float fVar53;
  uint uVar54;
  float fVar55;
  float fVar56;
  float fVar73;
  float fVar77;
  vint4 ai;
  uint uVar74;
  uint uVar78;
  float fVar81;
  uint uVar82;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar75;
  float fVar76;
  float fVar79;
  float fVar80;
  float fVar83;
  float fVar84;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  undefined1 auVar71 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar72;
  byte bVar85;
  float fVar86;
  byte bVar101;
  byte bVar102;
  byte bVar104;
  float fVar105;
  byte bVar108;
  byte bVar109;
  float fVar110;
  vint4 ai_1;
  uint uVar87;
  uint uVar106;
  uint uVar111;
  float fVar112;
  uint uVar113;
  undefined1 auVar89 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar90;
  byte bVar103;
  undefined1 auVar91 [16];
  float fVar88;
  undefined1 auVar92 [16];
  float fVar107;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar114;
  float fVar125;
  float fVar127;
  vint4 ai_2;
  StackItemT<embree::NodeRefPtr<4>_> SVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar130;
  float fVar140;
  float fVar142;
  vint4 ai_3;
  uint uVar131;
  uint uVar141;
  uint uVar143;
  float fVar145;
  uint uVar146;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar144;
  float fVar147;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  vint4 bi_3;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  vint4 bi_5;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar161 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  int iVar185;
  float fVar186;
  int iVar187;
  float fVar188;
  int iVar189;
  float fVar190;
  int iVar191;
  float fVar192;
  int iVar193;
  float fVar194;
  int iVar195;
  float fVar196;
  vint4 bi_1;
  int iVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fStack_1380;
  float fStack_137c;
  float fStack_1354;
  vbool<4> valid;
  undefined1 local_1338 [16];
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  RTCFilterFunctionNArguments args;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_128c;
  vfloat<4> tNear;
  float local_1218 [4];
  float local_1208 [4];
  float local_11f8 [4];
  float local_11e8 [4];
  undefined1 local_11d8 [16];
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined8 local_1178;
  ulong local_1170;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  ulong local_1150;
  long local_1148;
  long local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  long local_1118;
  ulong local_1110;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  uint local_1078;
  uint uStack_1074;
  uint uStack_1070;
  uint uStack_106c;
  uint local_1068;
  uint uStack_1064;
  uint uStack_1060;
  uint uStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  int local_1008;
  int iStack_1004;
  int iStack_1000;
  int iStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  int local_fb8;
  int iStack_fb4;
  int iStack_fb0;
  int iStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar50 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar114 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar125 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar164 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar55 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar200 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar167 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = uVar42 ^ 0x10;
  uVar39 = uVar44 ^ 0x10;
  uVar41 = uVar45 ^ 0x10;
  iVar40 = (tray->tnear).field_0.i[k];
  iVar191 = (tray->tfar).field_0.i[k];
  local_1150 = uVar42 >> 2;
  local_1158 = uVar46 >> 2;
  local_1160 = uVar44 >> 2;
  local_1168 = uVar39 >> 2;
  local_1170 = uVar45 >> 2;
  local_1178 = uVar41 >> 2;
  lVar33 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1038 = fVar114;
  fStack_1034 = fVar114;
  fStack_1030 = fVar114;
  fStack_102c = fVar114;
  local_1048 = fVar125;
  fStack_1044 = fVar125;
  fStack_1040 = fVar125;
  fStack_103c = fVar125;
  local_fe8 = fVar164;
  fStack_fe4 = fVar164;
  fStack_fe0 = fVar164;
  fStack_fdc = fVar164;
  local_1058 = fVar55;
  fStack_1054 = fVar55;
  fStack_1050 = fVar55;
  fStack_104c = fVar55;
  local_11b8 = fVar200;
  fStack_11b4 = fVar200;
  fStack_11b0 = fVar200;
  fStack_11ac = fVar200;
  local_ff8 = fVar167;
  fStack_ff4 = fVar167;
  fStack_ff0 = fVar167;
  fStack_fec = fVar167;
  local_1120 = uVar42;
  local_1128 = uVar44;
  local_1130 = uVar45;
  local_1138 = uVar46;
  local_1008 = iVar40;
  iStack_1004 = iVar40;
  iStack_1000 = iVar40;
  iStack_ffc = iVar40;
  fVar202 = fVar167;
  fVar126 = fVar167;
  fVar128 = fVar167;
  iVar185 = iVar40;
  iVar187 = iVar40;
  iVar189 = iVar40;
  iVar193 = iVar191;
  iVar195 = iVar191;
  iVar197 = iVar191;
  fVar127 = fVar125;
  fVar129 = fVar125;
  fVar179 = fVar125;
  fVar162 = fVar114;
  fVar175 = fVar114;
  fVar181 = fVar114;
  fVar75 = fVar55;
  fVar79 = fVar55;
  fVar83 = fVar55;
  fVar56 = fVar200;
  fVar76 = fVar200;
  fVar80 = fVar200;
  fVar84 = fVar164;
  fVar88 = fVar164;
  fVar107 = fVar164;
LAB_00735cc5:
  do {
    do {
      if (pSVar50 == stack) {
        return;
      }
      pSVar34 = pSVar50 + -1;
      pSVar50 = pSVar50 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar34->dist &&
             (float)pSVar34->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar34 = stack;
    pSVar48 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar50->ptr).ptr;
    while (((ulong)pSVar48 & 8) == 0) {
      pfVar1 = (float *)((long)&pSVar48[2].ptr.ptr + uVar42);
      fVar53 = (*pfVar1 - fVar114) * fVar55;
      fVar73 = (pfVar1[1] - fVar162) * fVar75;
      fVar77 = (pfVar1[2] - fVar175) * fVar79;
      fVar81 = (pfVar1[3] - fVar181) * fVar83;
      pfVar1 = (float *)((long)&pSVar48[2].ptr.ptr + uVar44);
      fVar86 = (*pfVar1 - fVar125) * fVar200;
      fVar105 = (pfVar1[1] - fVar127) * fVar56;
      fVar110 = (pfVar1[2] - fVar129) * fVar76;
      fVar112 = (pfVar1[3] - fVar179) * fVar80;
      uVar87 = (uint)((int)fVar86 < (int)fVar53) * (int)fVar53 |
               (uint)((int)fVar86 >= (int)fVar53) * (int)fVar86;
      uVar106 = (uint)((int)fVar105 < (int)fVar73) * (int)fVar73 |
                (uint)((int)fVar105 >= (int)fVar73) * (int)fVar105;
      uVar111 = (uint)((int)fVar110 < (int)fVar77) * (int)fVar77 |
                (uint)((int)fVar110 >= (int)fVar77) * (int)fVar110;
      uVar113 = (uint)((int)fVar112 < (int)fVar81) * (int)fVar81 |
                (uint)((int)fVar112 >= (int)fVar81) * (int)fVar112;
      pfVar1 = (float *)((long)&pSVar48[2].ptr.ptr + uVar45);
      fVar53 = (*pfVar1 - fVar164) * fVar167;
      fVar73 = (pfVar1[1] - fVar84) * fVar202;
      fVar77 = (pfVar1[2] - fVar88) * fVar126;
      fVar81 = (pfVar1[3] - fVar107) * fVar128;
      pfVar1 = (float *)((long)&pSVar48[2].ptr.ptr + uVar46);
      fVar86 = (*pfVar1 - fVar114) * fVar55;
      fVar105 = (pfVar1[1] - fVar162) * fVar75;
      fVar110 = (pfVar1[2] - fVar175) * fVar79;
      fVar112 = (pfVar1[3] - fVar181) * fVar83;
      pfVar1 = (float *)((long)&pSVar48[2].ptr.ptr + uVar39);
      fVar130 = (*pfVar1 - fVar125) * fVar200;
      fVar140 = (pfVar1[1] - fVar127) * fVar56;
      fVar142 = (pfVar1[2] - fVar129) * fVar76;
      fVar145 = (pfVar1[3] - fVar179) * fVar80;
      uVar131 = (uint)((int)fVar86 < (int)fVar130) * (int)fVar86 |
                (uint)((int)fVar86 >= (int)fVar130) * (int)fVar130;
      uVar141 = (uint)((int)fVar105 < (int)fVar140) * (int)fVar105 |
                (uint)((int)fVar105 >= (int)fVar140) * (int)fVar140;
      uVar143 = (uint)((int)fVar110 < (int)fVar142) * (int)fVar110 |
                (uint)((int)fVar110 >= (int)fVar142) * (int)fVar142;
      uVar146 = (uint)((int)fVar112 < (int)fVar145) * (int)fVar112 |
                (uint)((int)fVar112 >= (int)fVar145) * (int)fVar145;
      pfVar1 = (float *)((long)&pSVar48[2].ptr.ptr + uVar41);
      fVar86 = (*pfVar1 - fVar164) * fVar167;
      fVar105 = (pfVar1[1] - fVar84) * fVar202;
      fVar110 = (pfVar1[2] - fVar88) * fVar126;
      fVar112 = (pfVar1[3] - fVar107) * fVar128;
      uVar54 = (uint)((int)fVar53 < iVar40) * iVar40 | (uint)((int)fVar53 >= iVar40) * (int)fVar53;
      uVar74 = (uint)((int)fVar73 < iVar185) * iVar185 |
               (uint)((int)fVar73 >= iVar185) * (int)fVar73;
      uVar78 = (uint)((int)fVar77 < iVar187) * iVar187 |
               (uint)((int)fVar77 >= iVar187) * (int)fVar77;
      uVar82 = (uint)((int)fVar81 < iVar189) * iVar189 |
               (uint)((int)fVar81 >= iVar189) * (int)fVar81;
      tNear.field_0.i[0] =
           ((int)uVar54 < (int)uVar87) * uVar87 | ((int)uVar54 >= (int)uVar87) * uVar54;
      tNear.field_0.i[1] =
           ((int)uVar74 < (int)uVar106) * uVar106 | ((int)uVar74 >= (int)uVar106) * uVar74;
      tNear.field_0.i[2] =
           ((int)uVar78 < (int)uVar111) * uVar111 | ((int)uVar78 >= (int)uVar111) * uVar78;
      tNear.field_0.i[3] =
           ((int)uVar82 < (int)uVar113) * uVar113 | ((int)uVar82 >= (int)uVar113) * uVar82;
      uVar54 = (uint)(iVar191 < (int)fVar86) * iVar191 |
               (uint)(iVar191 >= (int)fVar86) * (int)fVar86;
      uVar74 = (uint)(iVar193 < (int)fVar105) * iVar193 |
               (uint)(iVar193 >= (int)fVar105) * (int)fVar105;
      uVar78 = (uint)(iVar195 < (int)fVar110) * iVar195 |
               (uint)(iVar195 >= (int)fVar110) * (int)fVar110;
      uVar82 = (uint)(iVar197 < (int)fVar112) * iVar197 |
               (uint)(iVar197 >= (int)fVar112) * (int)fVar112;
      auVar89._0_4_ =
           -(uint)((int)(((int)uVar131 < (int)uVar54) * uVar131 |
                        ((int)uVar131 >= (int)uVar54) * uVar54) < tNear.field_0.i[0]);
      auVar89._4_4_ =
           -(uint)((int)(((int)uVar141 < (int)uVar74) * uVar141 |
                        ((int)uVar141 >= (int)uVar74) * uVar74) < tNear.field_0.i[1]);
      auVar89._8_4_ =
           -(uint)((int)(((int)uVar143 < (int)uVar78) * uVar143 |
                        ((int)uVar143 >= (int)uVar78) * uVar78) < tNear.field_0.i[2]);
      auVar89._12_4_ =
           -(uint)((int)(((int)uVar146 < (int)uVar82) * uVar146 |
                        ((int)uVar146 >= (int)uVar82) * uVar82) < tNear.field_0.i[3]);
      iVar30 = movmskps((int)pSVar34,auVar89);
      if (iVar30 == 0xf) goto LAB_00735cc5;
      bVar29 = (byte)iVar30 ^ 0xf;
      uVar49 = (ulong)pSVar48 & 0xfffffffffffffff0;
      lVar37 = 0;
      if (bVar29 != 0) {
        for (; (bVar29 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
        }
      }
      pSVar34 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar49 + lVar37 * 8);
      uVar54 = bVar29 - 1 & (uint)bVar29;
      pSVar48 = pSVar34;
      if (uVar54 != 0) {
        uVar74 = tNear.field_0.i[lVar37];
        lVar37 = 0;
        if (uVar54 != 0) {
          for (; (uVar54 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
          }
        }
        pSVar48 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar49 + lVar37 * 8);
        uVar78 = tNear.field_0.i[lVar37];
        uVar54 = uVar54 - 1 & uVar54;
        if (uVar54 == 0) {
          if (uVar74 < uVar78) {
            (pSVar50->ptr).ptr = (size_t)pSVar48;
            pSVar50->dist = uVar78;
            pSVar48 = pSVar34;
            pSVar50 = pSVar50 + 1;
          }
          else {
            (pSVar50->ptr).ptr = (size_t)pSVar34;
            pSVar50->dist = uVar74;
            pSVar34 = pSVar48;
            pSVar50 = pSVar50 + 1;
          }
        }
        else {
          auVar133._8_4_ = uVar74;
          auVar133._0_8_ = pSVar34;
          auVar133._12_4_ = 0;
          auVar150._8_4_ = uVar78;
          auVar150._0_8_ = pSVar48;
          auVar150._12_4_ = 0;
          lVar37 = 0;
          if (uVar54 != 0) {
            for (; (uVar54 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar7 = *(undefined8 *)(uVar49 + lVar37 * 8);
          iVar30 = tNear.field_0.i[lVar37];
          auVar159._8_4_ = iVar30;
          auVar159._0_8_ = uVar7;
          auVar159._12_4_ = 0;
          auVar151._8_4_ = -(uint)((int)uVar74 < (int)uVar78);
          uVar54 = uVar54 - 1 & uVar54;
          if (uVar54 == 0) {
            auVar151._4_4_ = auVar151._8_4_;
            auVar151._0_4_ = auVar151._8_4_;
            auVar151._12_4_ = auVar151._8_4_;
            auVar148._8_4_ = uVar78;
            auVar148._0_8_ = pSVar48;
            auVar148._12_4_ = 0;
            auVar149 = blendvps(auVar148,auVar133,auVar151);
            auVar89 = blendvps(auVar133,auVar150,auVar151);
            auVar57._8_4_ = -(uint)(auVar149._8_4_ < iVar30);
            auVar57._4_4_ = auVar57._8_4_;
            auVar57._0_4_ = auVar57._8_4_;
            auVar57._12_4_ = auVar57._8_4_;
            auVar132._8_4_ = iVar30;
            auVar132._0_8_ = uVar7;
            auVar132._12_4_ = 0;
            auVar133 = blendvps(auVar132,auVar149,auVar57);
            auVar150 = blendvps(auVar149,auVar159,auVar57);
            auVar58._8_4_ = -(uint)(auVar89._8_4_ < auVar150._8_4_);
            auVar58._4_4_ = auVar58._8_4_;
            auVar58._0_4_ = auVar58._8_4_;
            auVar58._12_4_ = auVar58._8_4_;
            SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar150,auVar89,auVar58);
            SVar90 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar89,auVar150,auVar58);
            *pSVar50 = SVar90;
            pSVar50[1] = SVar115;
            pSVar34 = auVar133._0_8_;
            pSVar50 = pSVar50 + 2;
            pSVar48 = pSVar34;
          }
          else {
            lVar37 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            auVar149._4_4_ = auVar151._8_4_;
            auVar149._0_4_ = auVar151._8_4_;
            auVar149._8_4_ = auVar151._8_4_;
            auVar149._12_4_ = auVar151._8_4_;
            auVar151 = blendvps(auVar150,auVar133,auVar149);
            auVar89 = blendvps(auVar133,auVar150,auVar149);
            auVar158._8_4_ = tNear.field_0.i[lVar37];
            auVar158._0_8_ = *(undefined8 *)(uVar49 + lVar37 * 8);
            auVar158._12_4_ = 0;
            auVar59._8_4_ = -(uint)(iVar30 < tNear.field_0.i[lVar37]);
            auVar59._4_4_ = auVar59._8_4_;
            auVar59._0_4_ = auVar59._8_4_;
            auVar59._12_4_ = auVar59._8_4_;
            auVar150 = blendvps(auVar158,auVar159,auVar59);
            auVar133 = blendvps(auVar159,auVar158,auVar59);
            auVar60._8_4_ = -(uint)(auVar89._8_4_ < auVar133._8_4_);
            auVar60._4_4_ = auVar60._8_4_;
            auVar60._0_4_ = auVar60._8_4_;
            auVar60._12_4_ = auVar60._8_4_;
            auVar159 = blendvps(auVar133,auVar89,auVar60);
            SVar90 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar89,auVar133,auVar60);
            auVar61._8_4_ = -(uint)(auVar151._8_4_ < auVar150._8_4_);
            auVar61._4_4_ = auVar61._8_4_;
            auVar61._0_4_ = auVar61._8_4_;
            auVar61._12_4_ = auVar61._8_4_;
            auVar89 = blendvps(auVar150,auVar151,auVar61);
            auVar133 = blendvps(auVar151,auVar150,auVar61);
            auVar62._8_4_ = -(uint)(auVar133._8_4_ < auVar159._8_4_);
            auVar62._4_4_ = auVar62._8_4_;
            auVar62._0_4_ = auVar62._8_4_;
            auVar62._12_4_ = auVar62._8_4_;
            SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar159,auVar133,auVar62);
            SVar152 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar133,auVar159,auVar62);
            *pSVar50 = SVar90;
            pSVar50[1] = SVar152;
            pSVar50[2] = SVar115;
            pSVar34 = auVar89._0_8_;
            pSVar50 = pSVar50 + 3;
            pSVar48 = pSVar34;
          }
        }
      }
    }
    local_1148 = (ulong)((uint)pSVar48 & 0xf) - 8;
    uVar49 = (ulong)pSVar48 & 0xfffffffffffffff0;
    local_fb8 = iVar191;
    iStack_fb4 = iVar193;
    iStack_fb0 = iVar195;
    iStack_fac = iVar197;
    for (local_1140 = 0; local_1140 != local_1148; local_1140 = local_1140 + 1) {
      lVar37 = local_1140 * 0x58;
      local_1118 = lVar37 + uVar49;
      uVar38 = *(ulong *)(uVar49 + 0x20 + lVar37);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar38;
      uVar7 = *(undefined8 *)(uVar49 + 0x24 + lVar37);
      bVar29 = (byte)uVar38;
      bVar85 = (byte)uVar7;
      bVar10 = (byte)(uVar38 >> 8);
      bVar101 = (byte)((ulong)uVar7 >> 8);
      bVar11 = (byte)(uVar38 >> 0x10);
      bVar102 = (byte)((ulong)uVar7 >> 0x10);
      bVar12 = (byte)(uVar38 >> 0x18);
      bVar103 = (byte)((ulong)uVar7 >> 0x18);
      bVar13 = (byte)(uVar38 >> 0x20);
      bVar104 = (byte)((ulong)uVar7 >> 0x20);
      bVar14 = (byte)(uVar38 >> 0x28);
      bVar108 = (byte)((ulong)uVar7 >> 0x28);
      bVar15 = (byte)(uVar38 >> 0x30);
      bVar109 = (byte)((ulong)uVar7 >> 0x30);
      bVar24 = (byte)((ulong)uVar7 >> 0x38);
      bVar16 = (byte)(uVar38 >> 0x38);
      auVar91[0] = -((byte)((bVar29 < bVar85) * bVar29 | (bVar29 >= bVar85) * bVar85) == bVar29);
      auVar91[1] = -((byte)((bVar10 < bVar101) * bVar10 | (bVar10 >= bVar101) * bVar101) == bVar10);
      auVar91[2] = -((byte)((bVar11 < bVar102) * bVar11 | (bVar11 >= bVar102) * bVar102) == bVar11);
      auVar91[3] = -((byte)((bVar12 < bVar103) * bVar12 | (bVar12 >= bVar103) * bVar103) == bVar12);
      auVar91[4] = -((byte)((bVar13 < bVar104) * bVar13 | (bVar13 >= bVar104) * bVar104) == bVar13);
      auVar91[5] = -((byte)((bVar14 < bVar108) * bVar14 | (bVar14 >= bVar108) * bVar108) == bVar14);
      auVar91[6] = -((byte)((bVar15 < bVar109) * bVar15 | (bVar15 >= bVar109) * bVar109) == bVar15);
      auVar91[7] = -((byte)((bVar16 < bVar24) * bVar16 | (bVar16 >= bVar24) * bVar24) == bVar16);
      auVar91[8] = 0xff;
      auVar91[9] = 0xff;
      auVar91[10] = 0xff;
      auVar91[0xb] = 0xff;
      auVar91[0xc] = 0xff;
      auVar91[0xd] = 0xff;
      auVar91[0xe] = 0xff;
      auVar91[0xf] = 0xff;
      auVar116._8_4_ = 0xffffffff;
      auVar116._0_8_ = 0xffffffffffffffff;
      auVar116._12_4_ = 0xffffffff;
      auVar89 = pmovzxbd(auVar63,auVar91 ^ auVar116);
      auVar89 = auVar89 ^ auVar116;
      auVar64._0_4_ = auVar89._0_4_ << 0x1f;
      auVar64._4_4_ = auVar89._4_4_ << 0x1f;
      auVar64._8_4_ = auVar89._8_4_ << 0x1f;
      auVar64._12_4_ = auVar89._12_4_ << 0x1f;
      uVar31 = movmskps((int)local_1140,auVar64);
      fVar53 = *(float *)(uVar49 + 0x38 + lVar37);
      fVar73 = *(float *)(uVar49 + 0x3c + lVar37);
      fVar77 = *(float *)(uVar49 + 0x44 + lVar37);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(local_1150 + 0x20 + local_1118);
      auVar89 = pmovzxbd(auVar65,auVar65);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)(local_1158 + 0x20 + local_1118);
      auVar133 = pmovzxbd(auVar66,auVar66);
      fVar81 = *(float *)(uVar49 + 0x48 + lVar37);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)(local_1160 + 0x20 + local_1118);
      auVar150 = pmovzxbd(auVar92,auVar92);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = *(ulong *)(local_1168 + 0x20 + local_1118);
      auVar151 = pmovzxbd(auVar117,auVar117);
      fVar86 = *(float *)(uVar49 + 0x4c + lVar37);
      auVar153._8_8_ = 0;
      auVar153._0_8_ = *(ulong *)(local_1170 + 0x20 + local_1118);
      auVar159 = pmovzxbd(auVar153,auVar153);
      auVar160._8_8_ = 0;
      auVar160._0_8_ = *(ulong *)(local_1178 + 0x20 + local_1118);
      auVar149 = pmovzxbd(auVar160,auVar160);
      fVar105 = *(float *)(uVar49 + 0x40 + lVar37);
      fVar142 = (((float)auVar89._0_4_ * fVar77 + fVar53) - fVar114) * fVar55;
      fVar145 = (((float)auVar89._4_4_ * fVar77 + fVar53) - fVar162) * fVar75;
      fVar144 = (((float)auVar89._8_4_ * fVar77 + fVar53) - fVar175) * fVar79;
      fVar147 = (((float)auVar89._12_4_ * fVar77 + fVar53) - fVar181) * fVar83;
      fVar110 = (((float)auVar150._0_4_ * fVar81 + fVar73) - fVar125) * fVar200;
      fVar112 = (((float)auVar150._4_4_ * fVar81 + fVar73) - fVar127) * fVar56;
      fVar130 = (((float)auVar150._8_4_ * fVar81 + fVar73) - fVar129) * fVar76;
      fVar140 = (((float)auVar150._12_4_ * fVar81 + fVar73) - fVar179) * fVar80;
      uVar54 = (uint)((int)fVar110 < (int)fVar142) * (int)fVar142 |
               (uint)((int)fVar110 >= (int)fVar142) * (int)fVar110;
      uVar74 = (uint)((int)fVar112 < (int)fVar145) * (int)fVar145 |
               (uint)((int)fVar112 >= (int)fVar145) * (int)fVar112;
      uVar78 = (uint)((int)fVar130 < (int)fVar144) * (int)fVar144 |
               (uint)((int)fVar130 >= (int)fVar144) * (int)fVar130;
      uVar82 = (uint)((int)fVar140 < (int)fVar147) * (int)fVar147 |
               (uint)((int)fVar140 >= (int)fVar147) * (int)fVar140;
      fVar55 = (((float)auVar133._0_4_ * fVar77 + fVar53) - fVar114) * fVar55;
      fVar75 = (((float)auVar133._4_4_ * fVar77 + fVar53) - fVar162) * fVar75;
      fVar79 = (((float)auVar133._8_4_ * fVar77 + fVar53) - fVar175) * fVar79;
      fVar83 = (((float)auVar133._12_4_ * fVar77 + fVar53) - fVar181) * fVar83;
      fVar114 = (((float)auVar151._0_4_ * fVar81 + fVar73) - fVar125) * fVar200;
      fVar125 = (((float)auVar151._4_4_ * fVar81 + fVar73) - fVar127) * fVar56;
      fVar127 = (((float)auVar151._8_4_ * fVar81 + fVar73) - fVar129) * fVar76;
      fVar129 = (((float)auVar151._12_4_ * fVar81 + fVar73) - fVar179) * fVar80;
      uVar87 = (uint)((int)fVar55 < (int)fVar114) * (int)fVar55 |
               (uint)((int)fVar55 >= (int)fVar114) * (int)fVar114;
      uVar106 = (uint)((int)fVar75 < (int)fVar125) * (int)fVar75 |
                (uint)((int)fVar75 >= (int)fVar125) * (int)fVar125;
      uVar111 = (uint)((int)fVar79 < (int)fVar127) * (int)fVar79 |
                (uint)((int)fVar79 >= (int)fVar127) * (int)fVar127;
      uVar113 = (uint)((int)fVar83 < (int)fVar129) * (int)fVar83 |
                (uint)((int)fVar83 >= (int)fVar129) * (int)fVar129;
      fVar114 = (((float)auVar159._0_4_ * fVar86 + fVar105) - fVar164) * fVar167;
      fVar125 = (((float)auVar159._4_4_ * fVar86 + fVar105) - fVar84) * fVar202;
      fVar55 = (((float)auVar159._8_4_ * fVar86 + fVar105) - fVar88) * fVar126;
      fVar127 = (((float)auVar159._12_4_ * fVar86 + fVar105) - fVar107) * fVar128;
      uVar131 = (uint)((int)fVar114 < iVar40) * iVar40 |
                (uint)((int)fVar114 >= iVar40) * (int)fVar114;
      uVar141 = (uint)((int)fVar125 < iVar185) * iVar185 |
                (uint)((int)fVar125 >= iVar185) * (int)fVar125;
      uVar143 = (uint)((int)fVar55 < iVar187) * iVar187 |
                (uint)((int)fVar55 >= iVar187) * (int)fVar55;
      uVar146 = (uint)((int)fVar127 < iVar189) * iVar189 |
                (uint)((int)fVar127 >= iVar189) * (int)fVar127;
      dist.field_0.i[0] =
           ((int)uVar131 < (int)uVar54) * uVar54 | ((int)uVar131 >= (int)uVar54) * uVar131;
      dist.field_0.i[1] =
           ((int)uVar141 < (int)uVar74) * uVar74 | ((int)uVar141 >= (int)uVar74) * uVar141;
      dist.field_0.i[2] =
           ((int)uVar143 < (int)uVar78) * uVar78 | ((int)uVar143 >= (int)uVar78) * uVar143;
      dist.field_0.i[3] =
           ((int)uVar146 < (int)uVar82) * uVar82 | ((int)uVar146 >= (int)uVar82) * uVar146;
      fVar114 = (((float)auVar149._0_4_ * fVar86 + fVar105) - fVar164) * fVar167;
      fVar125 = (((float)auVar149._4_4_ * fVar86 + fVar105) - fVar84) * fVar202;
      fVar55 = (((float)auVar149._8_4_ * fVar86 + fVar105) - fVar88) * fVar126;
      fVar127 = (((float)auVar149._12_4_ * fVar86 + fVar105) - fVar107) * fVar128;
      uVar54 = (uint)(iVar191 < (int)fVar114) * iVar191 |
               (uint)(iVar191 >= (int)fVar114) * (int)fVar114;
      uVar74 = (uint)(iVar193 < (int)fVar125) * iVar193 |
               (uint)(iVar193 >= (int)fVar125) * (int)fVar125;
      uVar78 = (uint)(iVar195 < (int)fVar55) * iVar195 |
               (uint)(iVar195 >= (int)fVar55) * (int)fVar55;
      uVar82 = (uint)(iVar197 < (int)fVar127) * iVar197 |
               (uint)(iVar197 >= (int)fVar127) * (int)fVar127;
      auVar154._0_4_ =
           -(uint)((int)(((int)uVar87 < (int)uVar54) * uVar87 |
                        ((int)uVar87 >= (int)uVar54) * uVar54) < dist.field_0.i[0]);
      auVar154._4_4_ =
           -(uint)((int)(((int)uVar106 < (int)uVar74) * uVar106 |
                        ((int)uVar106 >= (int)uVar74) * uVar74) < dist.field_0.i[1]);
      auVar154._8_4_ =
           -(uint)((int)(((int)uVar111 < (int)uVar78) * uVar111 |
                        ((int)uVar111 >= (int)uVar78) * uVar78) < dist.field_0.i[2]);
      auVar154._12_4_ =
           -(uint)((int)(((int)uVar113 < (int)uVar82) * uVar113 |
                        ((int)uVar113 >= (int)uVar82) * uVar82) < dist.field_0.i[3]);
      uVar36 = movmskps((int)lVar37,auVar154);
      uVar38 = (ulong)(byte)(~(byte)uVar36 & (byte)uVar31);
      while (uVar38 != 0) {
        lVar37 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
          }
        }
        uVar38 = uVar38 & uVar38 - 1;
        fVar114 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)((long)&stack[-1].ptr.ptr + lVar37 * 4) <= fVar114) {
          uVar5 = *(ushort *)(local_1118 + lVar37 * 8);
          uVar6 = *(ushort *)(local_1118 + 2 + lVar37 * 8);
          uVar54 = *(uint *)(local_1118 + 0x50);
          fVar125 = *(float *)(local_1118 + 4 + lVar37 * 8);
          local_1110 = (ulong)(uint)fVar125;
          pGVar8 = (context->scene->geometries).items[uVar54].ptr;
          lVar37 = *(long *)&pGVar8->field_0x58;
          lVar43 = *(long *)&pGVar8[1].time_range.upper;
          lVar51 = (ulong)(uint)fVar125 *
                   pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar78 = uVar5 & 0x7fff;
          uVar82 = uVar6 & 0x7fff;
          uVar74 = *(uint *)(lVar37 + 4 + lVar51);
          uVar44 = (ulong)uVar74;
          uVar45 = (ulong)(uVar74 * uVar82 + *(int *)(lVar37 + lVar51) + uVar78);
          p_Var9 = pGVar8[1].intersectionFilterN;
          pfVar1 = (float *)(lVar43 + (long)p_Var9 * uVar45);
          fVar164 = *pfVar1;
          local_fd8 = pfVar1[1];
          fVar55 = pfVar1[2];
          pfVar1 = (float *)(lVar43 + (uVar45 + 1) * (long)p_Var9);
          local_1188 = *pfVar1;
          local_f98 = pfVar1[1];
          fVar200 = pfVar1[2];
          pfVar1 = (float *)(lVar43 + (uVar45 + uVar44) * (long)p_Var9);
          fVar167 = *pfVar1;
          fStack_fcc = pfVar1[1];
          local_fa8 = pfVar1[2];
          lVar47 = uVar45 + uVar44 + 1;
          pfVar1 = (float *)(lVar43 + lVar47 * (long)p_Var9);
          fVar127 = *pfVar1;
          fVar129 = pfVar1[1];
          fVar179 = pfVar1[2];
          uVar42 = (ulong)(-1 < (short)uVar5);
          pfVar1 = (float *)(lVar43 + (uVar45 + uVar42 + 1) * (long)p_Var9);
          fVar202 = pfVar1[2];
          lVar52 = uVar42 + lVar47;
          pfVar2 = (float *)(lVar43 + lVar52 * (long)p_Var9);
          fVar162 = *pfVar2;
          fVar175 = pfVar2[1];
          fVar181 = pfVar2[2];
          uVar42 = 0;
          if (-1 < (short)uVar6) {
            uVar42 = uVar44;
          }
          pfVar2 = (float *)(lVar43 + (uVar45 + uVar44 + uVar42) * (long)p_Var9);
          pfVar3 = (float *)(lVar43 + (lVar47 + uVar42) * (long)p_Var9);
          fVar79 = pfVar3[1];
          fVar83 = pfVar3[2];
          lVar47 = lVar43 + (uVar42 + lVar52) * (long)p_Var9;
          fVar53 = *(float *)(lVar47 + 4);
          fVar73 = *(float *)(lVar47 + 8);
          fStack_f94 = pfVar1[1];
          fStack_f90 = fVar175;
          fStack_f8c = fVar129;
          fVar88 = local_fd8 - local_f98;
          fVar107 = local_f98 - pfVar1[1];
          fVar77 = fVar129 - fVar175;
          fVar81 = fStack_fcc - fVar129;
          fVar130 = fVar55 - fVar200;
          fVar140 = fVar200 - fVar202;
          fVar142 = fVar179 - fVar181;
          fVar145 = local_fa8 - fVar179;
          fStack_1190 = fVar79;
          fStack_118c = pfVar2[1];
          fVar192 = fStack_fcc - local_fd8;
          fVar194 = fVar129 - local_f98;
          fVar196 = fVar79 - fVar129;
          fVar198 = pfVar2[1] - fStack_fcc;
          fStack_fa4 = fVar179;
          fStack_fa0 = fVar83;
          fStack_f9c = pfVar2[2];
          fVar199 = local_fa8 - fVar55;
          fVar201 = fVar179 - fVar200;
          fVar203 = fVar83 - fVar179;
          fVar204 = pfVar2[2] - local_fa8;
          local_11e8[0] = fVar130 * fVar192 - fVar88 * fVar199;
          local_11e8[1] = fVar140 * fVar194 - fVar107 * fVar201;
          local_11e8[2] = fVar142 * fVar196 - fVar77 * fVar203;
          local_11e8[3] = fVar145 * fVar198 - fVar81 * fVar204;
          local_11a8 = CONCAT44(fVar127,fVar167);
          local_1198 = *pfVar3;
          fStack_1194 = *pfVar2;
          fVar168 = fVar167 - fVar164;
          fVar170 = fVar127 - local_1188;
          fVar171 = *pfVar3 - fVar127;
          fVar172 = *pfVar2 - fVar167;
          fVar126 = *(float *)(ray + k * 4);
          fVar128 = *(float *)(ray + k * 4 + 0x10);
          local_12d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
          fStack_1354 = *(float *)(ray + k * 4 + 0x50);
          local_fc8 = fVar164 - fVar126;
          fStack_fc4 = local_1188 - fVar126;
          fStack_fc0 = fVar127 - fVar126;
          fStack_fbc = fVar167 - fVar126;
          local_fd8 = local_fd8 - fVar128;
          fStack_fd4 = local_f98 - fVar128;
          fStack_fd0 = fVar129 - fVar128;
          fStack_fcc = fStack_fcc - fVar128;
          fVar173 = local_fc8 * fStack_1354 - local_fd8 * (float)local_12d8._4_4_;
          fVar174 = fStack_fc4 * fStack_1354 - fStack_fd4 * (float)local_12d8._4_4_;
          fVar176 = fStack_fc0 * fStack_1354 - fStack_fd0 * (float)local_12d8._4_4_;
          fVar177 = fStack_fbc * fStack_1354 - fStack_fcc * (float)local_12d8._4_4_;
          fStack_1184 = *pfVar1;
          local_1178 = CONCAT44(fVar127,fVar162);
          fVar164 = fVar164 - local_1188;
          fVar165 = local_1188 - *pfVar1;
          fVar166 = fVar127 - fVar162;
          fVar167 = fVar167 - fVar127;
          local_11d8._0_4_ = fVar164 * fVar199 - fVar130 * fVar168;
          local_11d8._4_4_ = fVar165 * fVar201 - fVar140 * fVar170;
          local_11d8._8_4_ = fVar166 * fVar203 - fVar142 * fVar171;
          local_11d8._12_4_ = fVar167 * fVar204 - fVar145 * fVar172;
          fVar75 = *(float *)(ray + k * 4 + 0x20);
          fStack_128c = *(float *)(ray + k * 4 + 0x60);
          fVar55 = fVar55 - fVar75;
          fVar144 = fVar200 - fVar75;
          fVar147 = fVar179 - fVar75;
          fVar163 = local_fa8 - fVar75;
          fVar56 = fVar55 * (float)local_12d8._4_4_ - local_fc8 * fStack_128c;
          fVar76 = fVar144 * (float)local_12d8._4_4_ - fStack_fc4 * fStack_128c;
          fVar80 = fVar147 * (float)local_12d8._4_4_ - fStack_fc0 * fStack_128c;
          fVar84 = fVar163 * (float)local_12d8._4_4_ - fStack_fbc * fStack_128c;
          fVar86 = fVar88 * fVar168 - fVar164 * fVar192;
          fVar105 = fVar107 * fVar170 - fVar165 * fVar194;
          fVar110 = fVar77 * fVar171 - fVar166 * fVar196;
          fVar112 = fVar81 * fVar172 - fVar167 * fVar198;
          fVar184 = local_fd8 * fStack_128c - fVar55 * fStack_1354;
          fVar186 = fStack_fd4 * fStack_128c - fVar144 * fStack_1354;
          fVar188 = fStack_fd0 * fStack_128c - fVar147 * fStack_1354;
          fVar190 = fStack_fcc * fStack_128c - fVar163 * fStack_1354;
          local_12d8._0_4_ = local_12d8._4_4_;
          fStack_12d0 = (float)local_12d8._4_4_;
          fStack_12cc = (float)local_12d8._4_4_;
          fVar178 = local_11e8[0] * (float)local_12d8._4_4_ +
                    (float)local_11d8._0_4_ * fStack_1354 + fVar86 * fStack_128c;
          fVar180 = local_11e8[1] * (float)local_12d8._4_4_ +
                    (float)local_11d8._4_4_ * fStack_1354 + fVar105 * fStack_128c;
          fVar182 = local_11e8[2] * (float)local_12d8._4_4_ +
                    (float)local_11d8._8_4_ * fStack_1354 + fVar110 * fStack_128c;
          fVar183 = local_11e8[3] * (float)local_12d8._4_4_ +
                    (float)local_11d8._12_4_ * fStack_1354 + fVar112 * fStack_128c;
          uVar74 = (uint)fVar178 & 0x80000000;
          uVar87 = (uint)fVar180 & 0x80000000;
          uVar106 = (uint)fVar182 & 0x80000000;
          uVar111 = (uint)fVar183 & 0x80000000;
          fVar168 = (float)((uint)(fVar168 * fVar184 + fVar192 * fVar56 + fVar199 * fVar173) ^
                           uVar74);
          fVar170 = (float)((uint)(fVar170 * fVar186 + fVar194 * fVar76 + fVar201 * fVar174) ^
                           uVar87);
          fVar171 = (float)((uint)(fVar171 * fVar188 + fVar196 * fVar80 + fVar203 * fVar176) ^
                           uVar106);
          fVar172 = (float)((uint)(fVar172 * fVar190 + fVar198 * fVar84 + fVar204 * fVar177) ^
                           uVar111);
          fVar56 = (float)((uint)(fVar184 * fVar164 + fVar56 * fVar88 + fVar173 * fVar130) ^ uVar74)
          ;
          fVar76 = (float)((uint)(fVar186 * fVar165 + fVar76 * fVar107 + fVar174 * fVar140) ^ uVar87
                          );
          fVar80 = (float)((uint)(fVar188 * fVar166 + fVar80 * fVar77 + fVar176 * fVar142) ^ uVar106
                          );
          fVar167 = (float)((uint)(fVar190 * fVar167 + fVar84 * fVar81 + fVar177 * fVar145) ^
                           uVar111);
          fVar84 = ABS(fVar178);
          fVar88 = ABS(fVar180);
          fVar107 = ABS(fVar182);
          fVar77 = ABS(fVar183);
          bVar26 = fVar168 + fVar56 <= fVar84 &&
                   ((0.0 <= fVar168 && 0.0 <= fVar56) && fVar178 != 0.0);
          bVar27 = fVar170 + fVar76 <= fVar88 &&
                   ((0.0 <= fVar170 && 0.0 <= fVar76) && fVar180 != 0.0);
          bVar28 = fVar171 + fVar80 <= fVar107 &&
                   ((0.0 <= fVar171 && 0.0 <= fVar80) && fVar182 != 0.0);
          bVar25 = fVar172 + fVar167 <= fVar77 &&
                   ((0.0 <= fVar172 && 0.0 <= fVar167) && fVar183 != 0.0);
          auVar18._4_4_ = -(uint)bVar27;
          auVar18._0_4_ = -(uint)bVar26;
          auVar18._8_4_ = -(uint)bVar28;
          auVar18._12_4_ = -(uint)bVar25;
          iVar40 = movmskps((int)lVar43,auVar18);
          local_10f8 = ZEXT416(uVar54);
          local_1108 = ZEXT416((uint)fVar125);
          local_1018 = ZEXT416(uVar78);
          local_1028 = ZEXT416(uVar82);
          fVar164 = fVar125;
          local_1328 = fVar128;
          fStack_1324 = fVar128;
          fStack_1320 = fVar128;
          fStack_131c = fVar128;
          local_1318 = fVar126;
          fStack_1314 = fVar126;
          fStack_1310 = fVar126;
          fStack_130c = fVar126;
          if (iVar40 != 0) {
            fVar81 = (float)(uVar74 ^ (uint)(local_fc8 * local_11e8[0] +
                                            local_fd8 * (float)local_11d8._0_4_ + fVar55 * fVar86));
            fVar130 = (float)(uVar87 ^ (uint)(fStack_fc4 * local_11e8[1] +
                                             fStack_fd4 * (float)local_11d8._4_4_ +
                                             fVar144 * fVar105));
            fVar140 = (float)(uVar106 ^
                             (uint)(fStack_fc0 * local_11e8[2] +
                                   fStack_fd0 * (float)local_11d8._8_4_ + fVar147 * fVar110));
            fVar142 = (float)(uVar111 ^
                             (uint)(fStack_fbc * local_11e8[3] +
                                   fStack_fcc * (float)local_11d8._12_4_ + fVar163 * fVar112));
            fVar55 = *(float *)(ray + k * 4 + 0x30);
            valid.field_0.i[0] =
                 -(uint)((fVar55 * fVar84 < fVar81 && fVar81 <= fVar114 * fVar84) && bVar26);
            valid.field_0.i[1] =
                 -(uint)((fVar55 * fVar88 < fVar130 && fVar130 <= fVar114 * fVar88) && bVar27);
            valid.field_0.i[2] =
                 -(uint)((fVar55 * fVar107 < fVar140 && fVar140 <= fVar114 * fVar107) && bVar28);
            valid.field_0.i[3] =
                 -(uint)((fVar55 * fVar77 < fVar142 && fVar142 <= fVar114 * fVar77) && bVar25);
            iVar40 = movmskps(uVar78,(undefined1  [16])valid.field_0);
            if (iVar40 != 0) {
              local_11c8 = CONCAT44(fVar105,fVar86);
              uStack_11c0 = CONCAT44(fVar112,fVar110);
              auVar121._4_12_ = local_11d8._4_12_;
              auVar121._0_4_ = (float)(int)(*(ushort *)(lVar37 + 8 + lVar51) - 1);
              auVar156._4_4_ = local_11d8._4_4_;
              auVar156._0_4_ = auVar121._0_4_;
              auVar156._8_4_ = local_11d8._8_4_;
              auVar156._12_4_ = local_11d8._12_4_;
              auVar89 = rcpss(auVar156,auVar121);
              auVar122._0_4_ = (float)(int)(*(ushort *)(lVar37 + 10 + lVar51) - 1);
              auVar122._4_12_ = auVar121._4_12_;
              fVar114 = (2.0 - auVar121._0_4_ * auVar89._0_4_) * auVar89._0_4_;
              auVar161._4_4_ = local_11d8._4_4_;
              auVar161._0_4_ = auVar122._0_4_;
              auVar161._8_4_ = local_11d8._8_4_;
              auVar161._12_4_ = local_11d8._12_4_;
              auVar89 = rcpss(auVar161,auVar122);
              fVar55 = (2.0 - auVar122._0_4_ * auVar89._0_4_) * auVar89._0_4_;
              tNear.field_0.v[0] = fVar114 * ((float)uVar78 * fVar84 + fVar168);
              tNear.field_0.v[1] = fVar114 * ((float)(uVar78 + 1) * fVar88 + fVar170);
              tNear.field_0.v[2] = fVar114 * ((float)(uVar78 + 1) * fVar107 + fVar171);
              tNear.field_0.v[3] = fVar114 * ((float)uVar78 * fVar77 + fVar172);
              auVar123._0_4_ = (float)uVar82 * fVar84 + fVar56;
              auVar123._4_4_ = (float)uVar82 * fVar88 + fVar76;
              auVar123._8_4_ = (float)(uVar82 + 1) * fVar107 + fVar80;
              auVar123._12_4_ = (float)(uVar82 + 1) * fVar77 + fVar167;
              pGVar8 = (context->scene->geometries).items[uVar54].ptr;
              fVar164 = *(float *)(ray + k * 4 + 0x90);
              if ((pGVar8->mask & (uint)fVar164) != 0) {
                auVar21._4_4_ = fVar88;
                auVar21._0_4_ = fVar84;
                auVar21._8_4_ = fVar107;
                auVar21._12_4_ = fVar77;
                auVar89 = rcpps(auVar123,auVar21);
                fVar114 = auVar89._0_4_;
                fVar167 = auVar89._4_4_;
                fVar56 = auVar89._8_4_;
                fVar76 = auVar89._12_4_;
                fVar114 = (1.0 - fVar84 * fVar114) * fVar114 + fVar114;
                fVar167 = (1.0 - fVar88 * fVar167) * fVar167 + fVar167;
                fVar56 = (1.0 - fVar107 * fVar56) * fVar56 + fVar56;
                fVar76 = (1.0 - fVar77 * fVar76) * fVar76 + fVar76;
                fVar81 = fVar81 * fVar114;
                fVar130 = fVar130 * fVar167;
                fVar140 = fVar140 * fVar56;
                fVar142 = fVar142 * fVar76;
                local_11f8[0] = fVar81;
                local_11f8[1] = fVar130;
                local_11f8[2] = fVar140;
                local_11f8[3] = fVar142;
                local_1218[0] = tNear.field_0.v[0] * fVar114;
                local_1218[1] = tNear.field_0.v[1] * fVar167;
                local_1218[2] = tNear.field_0.v[2] * fVar56;
                local_1218[3] = tNear.field_0.v[3] * fVar76;
                local_1208[0] = fVar55 * auVar123._0_4_ * fVar114;
                local_1208[1] = fVar55 * auVar123._4_4_ * fVar167;
                local_1208[2] = fVar55 * auVar123._8_4_ * fVar56;
                local_1208[3] = fVar55 * auVar123._12_4_ * fVar76;
                auVar22._4_4_ = fVar130;
                auVar22._0_4_ = fVar81;
                auVar22._8_4_ = fVar140;
                auVar22._12_4_ = fVar142;
                auVar89 = blendvps(_DAT_01f45a30,auVar22,(undefined1  [16])valid.field_0);
                auVar157._4_4_ = auVar89._0_4_;
                auVar157._0_4_ = auVar89._4_4_;
                auVar157._8_4_ = auVar89._12_4_;
                auVar157._12_4_ = auVar89._8_4_;
                auVar133 = minps(auVar157,auVar89);
                auVar137._0_8_ = auVar133._8_8_;
                auVar137._8_4_ = auVar133._0_4_;
                auVar137._12_4_ = auVar133._4_4_;
                auVar133 = minps(auVar137,auVar133);
                uVar106 = -(uint)(auVar133._0_4_ == auVar89._0_4_);
                uVar111 = -(uint)(auVar133._4_4_ == auVar89._4_4_);
                uVar113 = -(uint)(auVar133._8_4_ == auVar89._8_4_);
                uVar131 = -(uint)(auVar133._12_4_ == auVar89._12_4_);
                auVar124._0_4_ = uVar106 & valid.field_0.i[0];
                auVar124._4_4_ = uVar111 & valid.field_0.i[1];
                auVar124._8_4_ = uVar113 & valid.field_0.i[2];
                auVar124._12_4_ = uVar131 & valid.field_0.i[3];
                iVar40 = movmskps(fVar164,auVar124);
                uVar74 = 0xffffffff;
                uVar78 = 0xffffffff;
                uVar82 = 0xffffffff;
                uVar87 = 0xffffffff;
                if (iVar40 != 0) {
                  uVar74 = uVar106;
                  uVar78 = uVar111;
                  uVar82 = uVar113;
                  uVar87 = uVar131;
                }
                auVar68._0_4_ = valid.field_0.i[0] & uVar74;
                auVar68._4_4_ = valid.field_0.i[1] & uVar78;
                auVar68._8_4_ = valid.field_0.i[2] & uVar82;
                auVar68._12_4_ = valid.field_0.i[3] & uVar87;
                uVar74 = movmskps(iVar40,auVar68);
                lVar43 = 0;
                if (uVar74 != 0) {
                  for (; (uVar74 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar114 = local_1218[lVar43];
                  fVar164 = local_1208[lVar43];
                  fVar55 = local_11e8[lVar43];
                  uVar31 = *(undefined4 *)(local_11d8 + lVar43 * 4);
                  uVar36 = *(undefined4 *)((long)&local_11c8 + lVar43 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_11f8[lVar43];
                  *(float *)(ray + k * 4 + 0xc0) = fVar55;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar31;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar36;
                  *(float *)(ray + k * 4 + 0xf0) = fVar114;
                  *(float *)(ray + k * 4 + 0x100) = fVar164;
                  *(float *)(ray + k * 4 + 0x110) = fVar125;
                  *(uint *)(ray + k * 4 + 0x120) = uVar54;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  fVar164 = (float)context->user->instPrimID[0];
                  *(float *)(ray + k * 4 + 0x140) = fVar164;
                }
                else {
                  uVar7 = *(undefined8 *)(mm_lookupmask_ps + lVar33);
                  local_1328 = (float)uVar7;
                  fStack_1324 = (float)((ulong)uVar7 >> 0x20);
                  fStack_1320 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
                  fStack_131c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar33 + 8) >>
                                       0x20);
                  _local_12d8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  local_1318 = fVar125;
                  fStack_1314 = fVar125;
                  fStack_1310 = fVar125;
                  fStack_130c = fVar125;
                  while( true ) {
                    local_10b8 = local_1218[lVar43];
                    local_10a8._4_4_ = local_1208[lVar43];
                    *(float *)(ray + k * 4 + 0x80) = local_11f8[lVar43];
                    args.context = context->user;
                    local_10e8 = local_11e8[lVar43];
                    local_10d8._4_4_ = *(undefined4 *)(local_11d8 + lVar43 * 4);
                    local_10c8._4_4_ = *(undefined4 *)((long)&local_11c8 + lVar43 * 4);
                    fStack_10e4 = local_10e8;
                    fStack_10e0 = local_10e8;
                    fStack_10dc = local_10e8;
                    local_10d8._0_4_ = local_10d8._4_4_;
                    local_10d8._8_4_ = local_10d8._4_4_;
                    local_10d8._12_4_ = local_10d8._4_4_;
                    local_10c8._0_4_ = local_10c8._4_4_;
                    local_10c8._8_4_ = local_10c8._4_4_;
                    local_10c8._12_4_ = local_10c8._4_4_;
                    fStack_10b4 = local_10b8;
                    fStack_10b0 = local_10b8;
                    fStack_10ac = local_10b8;
                    local_10a8._0_4_ = local_10a8._4_4_;
                    fStack_10a0 = (float)local_10a8._4_4_;
                    fStack_109c = (float)local_10a8._4_4_;
                    local_1098 = CONCAT44(fStack_1314,local_1318);
                    uStack_1090 = CONCAT44(fStack_130c,fStack_1310);
                    local_1088 = CONCAT44(uVar54,uVar54);
                    uStack_1080 = CONCAT44(uVar54,uVar54);
                    local_1078 = (args.context)->instID[0];
                    uStack_1074 = local_1078;
                    uStack_1070 = local_1078;
                    uStack_106c = local_1078;
                    local_1068 = (args.context)->instPrimID[0];
                    uStack_1064 = local_1068;
                    uStack_1060 = local_1068;
                    uStack_105c = local_1068;
                    local_1338._4_4_ = fStack_1324;
                    local_1338._0_4_ = local_1328;
                    local_1338._8_4_ = fStack_1320;
                    local_1338._12_4_ = fStack_131c;
                    args.valid = (int *)local_1338;
                    args.geometryUserPtr = pGVar8->userPtr;
                    args.hit = (RTCHitN *)&local_10e8;
                    args.N = 4;
                    pRVar35 = (RTCRayN *)pGVar8->intersectionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar35 != (RTCRayN *)0x0) {
                      pRVar35 = (RTCRayN *)(*(code *)pRVar35)(&args);
                    }
                    if (local_1338 == (undefined1  [16])0x0) {
                      auVar98._8_4_ = 0xffffffff;
                      auVar98._0_8_ = 0xffffffffffffffff;
                      auVar98._12_4_ = 0xffffffff;
                      auVar98 = auVar98 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar35 = (RTCRayN *)context->args->filter;
                      if ((pRVar35 != (RTCRayN *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar35 = (RTCRayN *)(*(code *)pRVar35)(&args);
                      }
                      auVar71._0_4_ = -(uint)(local_1338._0_4_ == 0);
                      auVar71._4_4_ = -(uint)(local_1338._4_4_ == 0);
                      auVar71._8_4_ = -(uint)(local_1338._8_4_ == 0);
                      auVar71._12_4_ = -(uint)(local_1338._12_4_ == 0);
                      auVar98 = auVar71 ^ _DAT_01f46b70;
                      if (local_1338 != (undefined1  [16])0x0) {
                        auVar89 = blendvps(*(undefined1 (*) [16])args.hit,
                                           *(undefined1 (*) [16])(args.ray + 0xc0),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                           *(undefined1 (*) [16])(args.ray + 0xd0),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                           *(undefined1 (*) [16])(args.ray + 0xe0),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                           *(undefined1 (*) [16])(args.ray + 0xf0),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                           *(undefined1 (*) [16])(args.ray + 0x100),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                           *(undefined1 (*) [16])(args.ray + 0x110),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                           *(undefined1 (*) [16])(args.ray + 0x120),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                           *(undefined1 (*) [16])(args.ray + 0x130),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                           *(undefined1 (*) [16])(args.ray + 0x140),auVar71);
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar89;
                        pRVar35 = args.ray;
                      }
                    }
                    if ((_DAT_01f46b40 & auVar98) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_12d8._0_4_;
                    }
                    else {
                      local_12d8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_12d8._4_4_ = 0;
                      fStack_12d0 = 0.0;
                      fStack_12cc = 0.0;
                    }
                    *(undefined4 *)(local_1338 + lVar43 * 4 + -0x10) = 0;
                    valid.field_0.i[0] =
                         -(uint)(fVar81 <= (float)local_12d8._0_4_) & valid.field_0.i[0];
                    valid.field_0.i[1] =
                         -(uint)(fVar130 <= (float)local_12d8._0_4_) & valid.field_0.i[1];
                    valid.field_0.i[2] =
                         -(uint)(fVar140 <= (float)local_12d8._0_4_) & valid.field_0.i[2];
                    valid.field_0.i[3] =
                         -(uint)(fVar142 <= (float)local_12d8._0_4_) & valid.field_0.i[3];
                    iVar40 = movmskps((int)pRVar35,(undefined1  [16])valid.field_0);
                    if (iVar40 == 0) break;
                    auVar23._4_4_ = fVar130;
                    auVar23._0_4_ = fVar81;
                    auVar23._8_4_ = fVar140;
                    auVar23._12_4_ = fVar142;
                    auVar133 = blendvps(_DAT_01f45a30,auVar23,(undefined1  [16])valid.field_0);
                    auVar139._4_4_ = auVar133._0_4_;
                    auVar139._0_4_ = auVar133._4_4_;
                    auVar139._8_4_ = auVar133._12_4_;
                    auVar139._12_4_ = auVar133._8_4_;
                    auVar89 = minps(auVar139,auVar133);
                    auVar99._0_8_ = auVar89._8_8_;
                    auVar99._8_4_ = auVar89._0_4_;
                    auVar99._12_4_ = auVar89._4_4_;
                    auVar89 = minps(auVar99,auVar89);
                    auVar100._0_8_ =
                         CONCAT44(-(uint)(auVar89._4_4_ == auVar133._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar89._0_4_ == auVar133._0_4_) & valid.field_0.i[0]);
                    auVar100._8_4_ = -(uint)(auVar89._8_4_ == auVar133._8_4_) & valid.field_0.i[2];
                    auVar100._12_4_ =
                         -(uint)(auVar89._12_4_ == auVar133._12_4_) & valid.field_0.i[3];
                    iVar40 = movmskps(iVar40,auVar100);
                    aVar72 = valid.field_0;
                    if (iVar40 != 0) {
                      aVar72.i[2] = auVar100._8_4_;
                      aVar72._0_8_ = auVar100._0_8_;
                      aVar72.i[3] = auVar100._12_4_;
                    }
                    uVar31 = movmskps(iVar40,(undefined1  [16])aVar72);
                    uVar42 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar31);
                    lVar43 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                      }
                    }
                  }
                  fVar126 = *(float *)(ray + k * 4);
                  fVar128 = *(float *)(ray + k * 4 + 0x10);
                  fVar75 = *(float *)(ray + k * 4 + 0x20);
                  local_12d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
                  local_12d8._0_4_ = local_12d8._4_4_;
                  fStack_12d0 = (float)local_12d8._4_4_;
                  fStack_12cc = (float)local_12d8._4_4_;
                  fStack_1354 = *(float *)(ray + k * 4 + 0x50);
                  fStack_128c = *(float *)(ray + k * 4 + 0x60);
                  fVar164 = 0.0;
                }
              }
            }
          }
          local_11a8._0_4_ = fVar127 - (float)local_11a8;
          local_11a8._4_4_ = fVar162 - local_11a8._4_4_;
          fStack_11a0 = fStack_1380 - fStack_11a0;
          fStack_119c = fStack_137c - fStack_119c;
          local_1198 = fVar129 - local_1198;
          fStack_1194 = fVar175 - fStack_1194;
          fStack_1190 = fVar53 - fStack_1190;
          fStack_118c = fVar79 - fStack_118c;
          fVar166 = fVar179 - local_fa8;
          fVar168 = fVar181 - fStack_fa4;
          fVar170 = fVar73 - fStack_fa0;
          fVar171 = fVar83 - fStack_f9c;
          local_1188 = local_1188 - fVar127;
          fStack_1184 = fStack_1184 - fVar162;
          fVar114 = fStack_1180 - fStack_1380;
          fVar55 = fStack_117c - fStack_137c;
          fVar130 = local_f98 - fVar129;
          fVar140 = fStack_f94 - fVar175;
          fVar142 = fStack_f90 - fVar53;
          fVar145 = fStack_f8c - fVar79;
          fVar200 = fVar200 - fVar179;
          fVar202 = fVar202 - fVar181;
          fVar172 = fVar181 - fVar73;
          fVar173 = fVar179 - fVar83;
          local_11e8[0] = fVar130 * fVar166 - fVar200 * local_1198;
          local_11e8[1] = fVar140 * fVar168 - fVar202 * fStack_1194;
          local_11e8[2] = fVar142 * fVar170 - fVar172 * fStack_1190;
          local_11e8[3] = fVar145 * fVar171 - fVar173 * fStack_118c;
          local_11d8._0_4_ = fVar200 * (float)local_11a8 - local_1188 * fVar166;
          local_11d8._4_4_ = fVar202 * local_11a8._4_4_ - fStack_1184 * fVar168;
          local_11d8._8_4_ = fVar172 * fStack_11a0 - fVar114 * fVar170;
          local_11d8._12_4_ = fVar173 * fStack_119c - fVar55 * fVar171;
          fVar144 = local_1188 * local_1198 - fVar130 * (float)local_11a8;
          fVar147 = fStack_1184 * fStack_1194 - fVar140 * local_11a8._4_4_;
          fVar163 = fVar114 * fStack_1190 - fVar142 * fStack_11a0;
          fVar165 = fVar55 * fStack_118c - fVar145 * fStack_119c;
          fVar127 = fVar127 - fVar126;
          fVar162 = fVar162 - fVar126;
          fStack_1380 = fStack_1380 - fVar126;
          fStack_137c = fStack_137c - fVar126;
          fVar129 = fVar129 - fVar128;
          fVar175 = fVar175 - fVar128;
          fVar53 = fVar53 - fVar128;
          fVar79 = fVar79 - fVar128;
          fVar179 = fVar179 - fVar75;
          fVar181 = fVar181 - fVar75;
          fVar73 = fVar73 - fVar75;
          fVar83 = fVar83 - fVar75;
          fVar56 = fVar129 * fStack_128c - fVar179 * fStack_1354;
          fVar76 = fVar175 * fStack_128c - fVar181 * fStack_1354;
          fVar80 = fVar53 * fStack_128c - fVar73 * fStack_1354;
          fVar84 = fVar79 * fStack_128c - fVar83 * fStack_1354;
          fVar88 = fVar179 * (float)local_12d8._0_4_ - fVar127 * fStack_128c;
          fVar107 = fVar181 * (float)local_12d8._4_4_ - fVar162 * fStack_128c;
          fVar77 = fVar73 * fStack_12d0 - fStack_1380 * fStack_128c;
          fVar81 = fVar83 * fStack_12cc - fStack_137c * fStack_128c;
          fVar86 = fVar127 * fStack_1354 - fVar129 * (float)local_12d8._0_4_;
          fVar105 = fVar162 * fStack_1354 - fVar175 * (float)local_12d8._4_4_;
          fVar110 = fStack_1380 * fStack_1354 - fVar53 * fStack_12d0;
          fVar112 = fStack_137c * fStack_1354 - fVar79 * fStack_12cc;
          fVar167 = (float)local_12d8._0_4_ * local_11e8[0] +
                    fStack_1354 * (float)local_11d8._0_4_ + fStack_128c * fVar144;
          fVar126 = (float)local_12d8._4_4_ * local_11e8[1] +
                    fStack_1354 * (float)local_11d8._4_4_ + fStack_128c * fVar147;
          fVar128 = fStack_12d0 * local_11e8[2] +
                    fStack_1354 * (float)local_11d8._8_4_ + fStack_128c * fVar163;
          fVar75 = fStack_12cc * local_11e8[3] +
                   fStack_1354 * (float)local_11d8._12_4_ + fStack_128c * fVar165;
          uVar74 = (uint)fVar167 & 0x80000000;
          uVar78 = (uint)fVar126 & 0x80000000;
          uVar82 = (uint)fVar128 & 0x80000000;
          uVar87 = (uint)fVar75 & 0x80000000;
          fVar130 = (float)((uint)(local_1188 * fVar56 + fVar130 * fVar88 + fVar200 * fVar86) ^
                           uVar74);
          fVar140 = (float)((uint)(fStack_1184 * fVar76 + fVar140 * fVar107 + fVar202 * fVar105) ^
                           uVar78);
          fVar142 = (float)((uint)(fVar114 * fVar80 + fVar142 * fVar77 + fVar172 * fVar110) ^ uVar82
                           );
          fVar145 = (float)((uint)(fVar55 * fVar84 + fVar145 * fVar81 + fVar173 * fVar112) ^ uVar87)
          ;
          auVar134._0_4_ =
               (float)((uint)(fVar56 * (float)local_11a8 + fVar88 * local_1198 + fVar86 * fVar166) ^
                      uVar74);
          auVar134._4_4_ =
               (float)((uint)(fVar76 * local_11a8._4_4_ + fVar107 * fStack_1194 + fVar105 * fVar168)
                      ^ uVar78);
          auVar134._8_4_ =
               (float)((uint)(fVar80 * fStack_11a0 + fVar77 * fStack_1190 + fVar110 * fVar170) ^
                      uVar82);
          auVar134._12_4_ =
               (float)((uint)(fVar84 * fStack_119c + fVar81 * fStack_118c + fVar112 * fVar171) ^
                      uVar87);
          fVar114 = ABS(fVar167);
          fVar55 = ABS(fVar126);
          fVar77 = ABS(fVar128);
          fVar81 = ABS(fVar75);
          bVar27 = fVar130 + auVar134._0_4_ <= fVar114 &&
                   ((0.0 <= auVar134._0_4_ && 0.0 <= fVar130) && fVar167 != 0.0);
          auVar93._0_4_ = -(uint)bVar27;
          bVar28 = fVar140 + auVar134._4_4_ <= fVar55 &&
                   ((0.0 <= auVar134._4_4_ && 0.0 <= fVar140) && fVar126 != 0.0);
          auVar93._4_4_ = -(uint)bVar28;
          bVar26 = fVar142 + auVar134._8_4_ <= fVar77 &&
                   ((0.0 <= auVar134._8_4_ && 0.0 <= fVar142) && fVar128 != 0.0);
          auVar93._8_4_ = -(uint)bVar26;
          bVar25 = fVar145 + auVar134._12_4_ <= fVar81 &&
                   ((0.0 <= auVar134._12_4_ && 0.0 <= fVar145) && fVar75 != 0.0);
          auVar93._12_4_ = -(uint)bVar25;
          iVar30 = movmskps(fVar164,auVar93);
          uVar42 = local_1120;
          uVar44 = local_1128;
          uVar45 = local_1130;
          uVar46 = local_1138;
          fVar167 = local_ff8;
          fVar202 = fStack_ff4;
          fVar126 = fStack_ff0;
          fVar128 = fStack_fec;
          iVar40 = local_1008;
          iVar185 = iStack_1004;
          iVar187 = iStack_1000;
          iVar189 = iStack_ffc;
          iVar191 = local_fb8;
          iVar193 = iStack_fb4;
          iVar195 = iStack_fb0;
          iVar197 = iStack_fac;
          fVar200 = local_11b8;
          fVar56 = fStack_11b4;
          fVar76 = fStack_11b0;
          fVar80 = fStack_11ac;
          fVar164 = local_fe8;
          fVar84 = fStack_fe4;
          fVar88 = fStack_fe0;
          fVar107 = fStack_fdc;
          if (iVar30 != 0) {
            fVar179 = (float)(uVar74 ^ (uint)(fVar127 * local_11e8[0] +
                                             fVar129 * (float)local_11d8._0_4_ + fVar179 * fVar144))
            ;
            fVar162 = (float)(uVar78 ^ (uint)(fVar162 * local_11e8[1] +
                                             fVar175 * (float)local_11d8._4_4_ + fVar181 * fVar147))
            ;
            fVar175 = (float)(uVar82 ^ (uint)(fStack_1380 * local_11e8[2] +
                                             fVar53 * (float)local_11d8._8_4_ + fVar73 * fVar163));
            fVar181 = (float)(uVar87 ^ (uint)(fStack_137c * local_11e8[3] +
                                             fVar79 * (float)local_11d8._12_4_ + fVar83 * fVar165));
            fVar127 = *(float *)(ray + k * 4 + 0x30);
            fVar129 = *(float *)(ray + k * 4 + 0x80);
            valid.field_0.i[0] =
                 -(uint)((fVar179 <= fVar129 * fVar114 && fVar127 * fVar114 < fVar179) && bVar27);
            valid.field_0.i[1] =
                 -(uint)((fVar162 <= fVar129 * fVar55 && fVar127 * fVar55 < fVar162) && bVar28);
            valid.field_0.i[2] =
                 -(uint)((fVar175 <= fVar129 * fVar77 && fVar127 * fVar77 < fVar175) && bVar26);
            valid.field_0.i[3] =
                 -(uint)((fVar181 <= fVar129 * fVar81 && fVar127 * fVar81 < fVar181) && bVar25);
            iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
            if (iVar30 != 0) {
              local_11c8 = CONCAT44(fVar147,fVar144);
              uStack_11c0 = CONCAT44(fVar165,fVar163);
              auVar155._0_4_ = fVar114 - auVar134._0_4_;
              auVar155._4_4_ = fVar55 - auVar134._4_4_;
              auVar155._8_4_ = fVar77 - auVar134._8_4_;
              auVar155._12_4_ = fVar81 - auVar134._12_4_;
              auVar135._4_12_ = auVar134._4_12_;
              auVar135._0_4_ = (float)(int)(*(ushort *)(lVar37 + 8 + lVar51) - 1);
              auVar118._4_4_ = auVar134._4_4_;
              auVar118._0_4_ = auVar135._0_4_;
              auVar118._8_4_ = auVar134._8_4_;
              auVar118._12_4_ = auVar134._12_4_;
              auVar89 = rcpss(auVar118,auVar135);
              fVar127 = (2.0 - auVar135._0_4_ * auVar89._0_4_) * auVar89._0_4_;
              auVar119._4_12_ = auVar89._4_12_;
              auVar119._0_4_ = (float)(int)(*(ushort *)(lVar37 + 10 + lVar51) - 1);
              auVar169._4_4_ = auVar89._4_4_;
              auVar169._0_4_ = auVar119._0_4_;
              auVar169._8_4_ = auVar89._8_4_;
              auVar169._12_4_ = auVar89._12_4_;
              auVar89 = rcpss(auVar169,auVar119);
              fVar75 = (2.0 - auVar119._0_4_ * auVar89._0_4_) * auVar89._0_4_;
              tNear.field_0.v[0] =
                   fVar127 * ((float)(int)local_1018._0_4_ * fVar114 + (fVar114 - fVar130));
              tNear.field_0.v[1] =
                   fVar127 * ((float)(local_1018._0_4_ + 1) * fVar55 + (fVar55 - fVar140));
              tNear.field_0.v[2] =
                   fVar127 * ((float)(local_1018._0_4_ + 1) * fVar77 + (fVar77 - fVar142));
              tNear.field_0.v[3] =
                   fVar127 * ((float)(int)local_1018._0_4_ * fVar81 + (fVar81 - fVar145));
              pGVar8 = (context->scene->geometries).items[uVar54].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar17._4_4_ = fVar55;
                auVar17._0_4_ = fVar114;
                auVar17._8_4_ = fVar77;
                auVar17._12_4_ = fVar81;
                auVar89 = rcpps(auVar155,auVar17);
                fVar127 = auVar89._0_4_;
                fVar79 = auVar89._4_4_;
                fVar83 = auVar89._8_4_;
                fVar53 = auVar89._12_4_;
                fVar127 = (1.0 - fVar114 * fVar127) * fVar127 + fVar127;
                fVar79 = (1.0 - fVar55 * fVar79) * fVar79 + fVar79;
                fVar83 = (1.0 - fVar77 * fVar83) * fVar83 + fVar83;
                fVar53 = (1.0 - fVar81 * fVar53) * fVar53 + fVar53;
                fVar179 = fVar179 * fVar127;
                fVar162 = fVar162 * fVar79;
                fVar175 = fVar175 * fVar83;
                fVar181 = fVar181 * fVar53;
                local_11f8[0] = fVar179;
                local_11f8[1] = fVar162;
                local_11f8[2] = fVar175;
                local_11f8[3] = fVar181;
                local_1218[0] = tNear.field_0.v[0] * fVar127;
                local_1218[1] = tNear.field_0.v[1] * fVar79;
                local_1218[2] = tNear.field_0.v[2] * fVar83;
                local_1218[3] = tNear.field_0.v[3] * fVar53;
                local_1208[0] =
                     fVar75 * ((float)(int)local_1028._0_4_ * fVar114 + auVar155._0_4_) * fVar127;
                local_1208[1] =
                     fVar75 * ((float)(int)local_1028._0_4_ * fVar55 + auVar155._4_4_) * fVar79;
                local_1208[2] =
                     fVar75 * ((float)(local_1028._0_4_ + 1) * fVar77 + auVar155._8_4_) * fVar83;
                local_1208[3] =
                     fVar75 * ((float)(local_1028._0_4_ + 1) * fVar81 + auVar155._12_4_) * fVar53;
                auVar19._4_4_ = fVar162;
                auVar19._0_4_ = fVar179;
                auVar19._8_4_ = fVar175;
                auVar19._12_4_ = fVar181;
                auVar133 = blendvps(_DAT_01f45a30,auVar19,(undefined1  [16])valid.field_0);
                auVar136._4_4_ = auVar133._0_4_;
                auVar136._0_4_ = auVar133._4_4_;
                auVar136._8_4_ = auVar133._12_4_;
                auVar136._12_4_ = auVar133._8_4_;
                auVar89 = minps(auVar136,auVar133);
                auVar94._0_8_ = auVar89._8_8_;
                auVar94._8_4_ = auVar89._0_4_;
                auVar94._12_4_ = auVar89._4_4_;
                auVar89 = minps(auVar94,auVar89);
                uVar106 = -(uint)(auVar89._0_4_ == auVar133._0_4_);
                uVar111 = -(uint)(auVar89._4_4_ == auVar133._4_4_);
                uVar113 = -(uint)(auVar89._8_4_ == auVar133._8_4_);
                uVar131 = -(uint)(auVar89._12_4_ == auVar133._12_4_);
                auVar120._0_4_ = uVar106 & valid.field_0.i[0];
                auVar120._4_4_ = uVar111 & valid.field_0.i[1];
                auVar120._8_4_ = uVar113 & valid.field_0.i[2];
                auVar120._12_4_ = uVar131 & valid.field_0.i[3];
                iVar30 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar120);
                uVar74 = 0xffffffff;
                uVar78 = 0xffffffff;
                uVar82 = 0xffffffff;
                uVar87 = 0xffffffff;
                if (iVar30 != 0) {
                  uVar74 = uVar106;
                  uVar78 = uVar111;
                  uVar82 = uVar113;
                  uVar87 = uVar131;
                }
                auVar67._0_4_ = valid.field_0.i[0] & uVar74;
                auVar67._4_4_ = valid.field_0.i[1] & uVar78;
                auVar67._8_4_ = valid.field_0.i[2] & uVar82;
                auVar67._12_4_ = valid.field_0.i[3] & uVar87;
                uVar74 = movmskps(iVar30,auVar67);
                lVar37 = 0;
                if (uVar74 != 0) {
                  for (; (uVar74 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar114 = local_1218[lVar37];
                  fVar55 = local_1208[lVar37];
                  fVar127 = local_11e8[lVar37];
                  uVar31 = *(undefined4 *)(local_11d8 + lVar37 * 4);
                  uVar36 = *(undefined4 *)((long)&local_11c8 + lVar37 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_11f8[lVar37];
                  *(float *)(ray + k * 4 + 0xc0) = fVar127;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar31;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar36;
                  *(float *)(ray + k * 4 + 0xf0) = fVar114;
                  *(float *)(ray + k * 4 + 0x100) = fVar55;
                  *(float *)(ray + k * 4 + 0x110) = fVar125;
                  *(uint *)(ray + k * 4 + 0x120) = uVar54;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  uVar36 = local_10f8._0_4_;
                  uVar31 = local_1108._0_4_;
                  uVar7 = *(undefined8 *)(mm_lookupmask_ps + lVar33);
                  local_1188 = (float)uVar7;
                  fStack_1184 = (float)((ulong)uVar7 >> 0x20);
                  fStack_1180 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
                  fStack_117c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar33 + 8) >>
                                       0x20);
                  while( true ) {
                    fStack_137c = 0.0;
                    fStack_1380 = 0.0;
                    local_10b8 = local_1218[lVar37];
                    fVar114 = local_1208[lVar37];
                    *(float *)(ray + k * 4 + 0x80) = local_11f8[lVar37];
                    args.context = context->user;
                    local_10a8._4_4_ = fVar114;
                    local_10a8._0_4_ = fVar114;
                    fStack_10a0 = fVar114;
                    fStack_109c = fVar114;
                    local_10e8 = local_11e8[lVar37];
                    uVar32 = *(undefined4 *)(local_11d8 + lVar37 * 4);
                    uVar4 = *(undefined4 *)((long)&local_11c8 + lVar37 * 4);
                    local_10d8._4_4_ = uVar32;
                    local_10d8._0_4_ = uVar32;
                    local_10d8._8_4_ = uVar32;
                    local_10d8._12_4_ = uVar32;
                    local_10c8._4_4_ = uVar4;
                    local_10c8._0_4_ = uVar4;
                    local_10c8._8_4_ = uVar4;
                    local_10c8._12_4_ = uVar4;
                    fStack_10e4 = local_10e8;
                    fStack_10e0 = local_10e8;
                    fStack_10dc = local_10e8;
                    fStack_10b4 = local_10b8;
                    fStack_10b0 = local_10b8;
                    fStack_10ac = local_10b8;
                    local_1098 = CONCAT44(uVar31,uVar31);
                    uStack_1090 = CONCAT44(uVar31,uVar31);
                    local_1088 = CONCAT44(uVar36,uVar36);
                    uStack_1080 = CONCAT44(uVar36,uVar36);
                    local_1078 = (args.context)->instID[0];
                    uStack_1074 = local_1078;
                    uStack_1070 = local_1078;
                    uStack_106c = local_1078;
                    local_1068 = (args.context)->instPrimID[0];
                    uStack_1064 = local_1068;
                    uStack_1060 = local_1068;
                    uStack_105c = local_1068;
                    local_1338._4_4_ = fStack_1184;
                    local_1338._0_4_ = local_1188;
                    local_1338._8_4_ = fStack_1180;
                    local_1338._12_4_ = fStack_117c;
                    args.valid = (int *)local_1338;
                    args.geometryUserPtr = pGVar8->userPtr;
                    args.hit = (RTCHitN *)&local_10e8;
                    args.N = 4;
                    pRVar35 = (RTCRayN *)pGVar8->intersectionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar35 != (RTCRayN *)0x0) {
                      pRVar35 = (RTCRayN *)(*(code *)pRVar35)(&args);
                      fVar200 = local_11b8;
                      fVar56 = fStack_11b4;
                      fVar76 = fStack_11b0;
                      fVar80 = fStack_11ac;
                    }
                    if (local_1338 == (undefined1  [16])0x0) {
                      auVar95._8_4_ = 0xffffffff;
                      auVar95._0_8_ = 0xffffffffffffffff;
                      auVar95._12_4_ = 0xffffffff;
                      auVar95 = auVar95 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar35 = (RTCRayN *)context->args->filter;
                      if ((pRVar35 != (RTCRayN *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar35 = (RTCRayN *)(*(code *)pRVar35)(&args);
                        fVar200 = local_11b8;
                        fVar56 = fStack_11b4;
                        fVar76 = fStack_11b0;
                        fVar80 = fStack_11ac;
                      }
                      auVar69._0_4_ = -(uint)(local_1338._0_4_ == 0);
                      auVar69._4_4_ = -(uint)(local_1338._4_4_ == 0);
                      auVar69._8_4_ = -(uint)(local_1338._8_4_ == 0);
                      auVar69._12_4_ = -(uint)(local_1338._12_4_ == 0);
                      auVar95 = auVar69 ^ _DAT_01f46b70;
                      if (local_1338 != (undefined1  [16])0x0) {
                        auVar89 = blendvps(*(undefined1 (*) [16])args.hit,
                                           *(undefined1 (*) [16])(args.ray + 0xc0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                           *(undefined1 (*) [16])(args.ray + 0xd0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                           *(undefined1 (*) [16])(args.ray + 0xe0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                           *(undefined1 (*) [16])(args.ray + 0xf0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                           *(undefined1 (*) [16])(args.ray + 0x100),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                           *(undefined1 (*) [16])(args.ray + 0x110),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                           *(undefined1 (*) [16])(args.ray + 0x120),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                           *(undefined1 (*) [16])(args.ray + 0x130),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar89;
                        auVar89 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                           *(undefined1 (*) [16])(args.ray + 0x140),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar89;
                        pRVar35 = args.ray;
                      }
                    }
                    if ((_DAT_01f46b40 & auVar95) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar129;
                    }
                    else {
                      fVar129 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1338 + lVar37 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar179 <= fVar129) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar162 <= fVar129) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar175 <= fVar129) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar181 <= fVar129) & valid.field_0.i[3];
                    iVar30 = movmskps((int)pRVar35,(undefined1  [16])valid.field_0);
                    uVar42 = local_1120;
                    uVar44 = local_1128;
                    uVar45 = local_1130;
                    uVar46 = local_1138;
                    fVar167 = local_ff8;
                    fVar202 = fStack_ff4;
                    fVar126 = fStack_ff0;
                    fVar128 = fStack_fec;
                    iVar40 = local_1008;
                    iVar185 = iStack_1004;
                    iVar187 = iStack_1000;
                    iVar189 = iStack_ffc;
                    iVar191 = local_fb8;
                    iVar193 = iStack_fb4;
                    iVar195 = iStack_fb0;
                    iVar197 = iStack_fac;
                    fVar164 = local_fe8;
                    fVar84 = fStack_fe4;
                    fVar88 = fStack_fe0;
                    fVar107 = fStack_fdc;
                    if (iVar30 == 0) break;
                    auVar20._4_4_ = fVar162;
                    auVar20._0_4_ = fVar179;
                    auVar20._8_4_ = fVar175;
                    auVar20._12_4_ = fVar181;
                    auVar133 = blendvps(_DAT_01f45a30,auVar20,(undefined1  [16])valid.field_0);
                    auVar138._4_4_ = auVar133._0_4_;
                    auVar138._0_4_ = auVar133._4_4_;
                    auVar138._8_4_ = auVar133._12_4_;
                    auVar138._12_4_ = auVar133._8_4_;
                    auVar89 = minps(auVar138,auVar133);
                    auVar96._0_8_ = auVar89._8_8_;
                    auVar96._8_4_ = auVar89._0_4_;
                    auVar96._12_4_ = auVar89._4_4_;
                    auVar89 = minps(auVar96,auVar89);
                    auVar97._0_8_ =
                         CONCAT44(-(uint)(auVar89._4_4_ == auVar133._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar89._0_4_ == auVar133._0_4_) & valid.field_0.i[0]);
                    auVar97._8_4_ = -(uint)(auVar89._8_4_ == auVar133._8_4_) & valid.field_0.i[2];
                    auVar97._12_4_ = -(uint)(auVar89._12_4_ == auVar133._12_4_) & valid.field_0.i[3]
                    ;
                    iVar40 = movmskps(iVar30,auVar97);
                    aVar70 = valid.field_0;
                    if (iVar40 != 0) {
                      aVar70.i[2] = auVar97._8_4_;
                      aVar70._0_8_ = auVar97._0_8_;
                      aVar70.i[3] = auVar97._12_4_;
                    }
                    uVar32 = movmskps(iVar40,(undefined1  [16])aVar70);
                    uVar42 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar32);
                    lVar37 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      fVar125 = local_1048;
      fVar127 = fStack_1044;
      fVar129 = fStack_1040;
      fVar179 = fStack_103c;
      fVar114 = local_1038;
      fVar162 = fStack_1034;
      fVar175 = fStack_1030;
      fVar181 = fStack_102c;
      fVar55 = local_1058;
      fVar75 = fStack_1054;
      fVar79 = fStack_1050;
      fVar83 = fStack_104c;
    }
    iVar191 = *(int *)(ray + k * 4 + 0x80);
    iVar193 = iVar191;
    iVar195 = iVar191;
    iVar197 = iVar191;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }